

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O1

void session_reschedule_stream(nghttp2_session *session,nghttp2_stream *stream)

{
  size_t sVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  nghttp2_pq *pq;
  
  sVar1 = (stream->item->frame).hd.length;
  stream->last_writelen = sVar1;
  if ((stream->flags & 0x10) == 0) {
    nghttp2_stream_reschedule(stream);
    return;
  }
  if (session->server != '\0') {
    uVar2 = stream->extpri & 0x7f;
    if (7 < (byte)uVar2) {
      __assert_fail("urgency < NGHTTP2_EXTPRI_URGENCY_LEVELS",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                    ,0x430,
                    "void session_sched_reschedule_stream(nghttp2_session *, nghttp2_stream *)");
    }
    if ((char)stream->extpri < '\0') {
      pq = &session->sched[uVar2].ob_data;
      sVar4 = nghttp2_pq_size(pq);
      if (sVar4 != 1) {
        nghttp2_pq_remove(pq,&stream->pq_entry);
        stream->cycle = stream->cycle + sVar1;
        iVar3 = nghttp2_pq_push(pq,&stream->pq_entry);
        if (iVar3 != 0) {
          __assert_fail("0 == rv",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                        ,0x43e,
                        "void session_sched_reschedule_stream(nghttp2_session *, nghttp2_stream *)")
          ;
        }
      }
    }
  }
  return;
}

Assistant:

static void session_reschedule_stream(nghttp2_session *session,
                                      nghttp2_stream *stream) {
  stream->last_writelen = stream->item->frame.hd.length;

  if (!(stream->flags & NGHTTP2_STREAM_FLAG_NO_RFC7540_PRIORITIES)) {
    nghttp2_stream_reschedule(stream);
    return;
  }

  if (!session->server) {
    return;
  }

  session_sched_reschedule_stream(session, stream);
}